

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O2

ssize_t __thiscall
zmq::detail::socket_base::recv(socket_base *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  error_t *this_00;
  undefined4 in_register_00000034;
  
  uVar2 = zmq_recv(*(undefined8 *)CONCAT44(in_register_00000034,__fd),__buf,__n,__flags);
  if ((int)uVar2 < 0) {
    iVar3 = zmq_errno();
    if (iVar3 != 0xb) {
      this_00 = (error_t *)__cxa_allocate_exception(0x10);
      error_t::error_t(this_00);
      __cxa_throw(this_00,&error_t::typeinfo,std::exception::~exception);
    }
    uVar1 = 0;
  }
  else {
    pvVar4 = (void *)(ulong)uVar2;
    if (pvVar4 < __n) {
      __n = (size_t)pvVar4;
    }
    this->_handle = (void *)__n;
    this[1]._handle = pvVar4;
    uVar1 = 1;
  }
  *(undefined1 *)&this[2]._handle = uVar1;
  return (ssize_t)this;
}

Assistant:

ZMQ_NODISCARD
    recv_buffer_result_t recv(mutable_buffer buf,
                              recv_flags flags = recv_flags::none)
    {
        const int nbytes =
          zmq_recv(_handle, buf.data(), buf.size(), static_cast<int>(flags));
        if (nbytes >= 0) {
            return recv_buffer_size{
              (std::min)(static_cast<size_t>(nbytes), buf.size()),
              static_cast<size_t>(nbytes)};
        }
        if (zmq_errno() == EAGAIN)
            return {};
        throw error_t();
    }